

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_C2S_UDP_DATA_check(void)

{
  int32_t iVar1;
  int iVar2;
  uint8_t local_1d8 [8];
  uint8_t buf6 [29];
  uint8_t buf5 [29];
  uint8_t local_18d [8];
  uint8_t buf4 [5];
  uint8_t buf3 [28];
  uint8_t buf2 [30];
  uint8_t buf1 [30];
  PipeMsg msg;
  
  MsgHelper::initMsg((PipeMsg *)(buf1 + 0x18),C2S_UDP_DATA);
  stack0xfffffffffffffeb8 = 0xfe040d0000000204;
  buf1[0] = 0x80;
  buf1[1] = '\0';
  buf1[2] = '\0';
  buf1[3] = '\0';
  buf1[4] = '\0';
  buf1[5] = '\0';
  buf1[6] = '\0';
  buf1[7] = '\0';
  buf1[8] = '\0';
  buf1[9] = '\0';
  buf1[10] = '\0';
  buf1[0xb] = '\0';
  buf1[0xc] = '\x01';
  buf1[0xd] = '\0';
  buf1[0xe] = '\0';
  buf1[0xf] = 0xff;
  buf1[0x10] = 0xff;
  buf1[0x11] = '\x01';
  buf1[0x12] = '\x02';
  buf1[0x13] = '\x03';
  buf1[0x14] = '\x04';
  buf1[0x15] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf2 + 0x18,0x1e,(PipeMsg *)(buf1 + 0x18));
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x14e,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 0x18));
  stack0xfffffffffffffe98 = 0xfe04040302010204;
  buf2[0] = 0x80;
  buf2[1] = '\0';
  buf2[2] = '\0';
  buf2[3] = '\0';
  buf2[4] = '\0';
  buf2[5] = '\0';
  buf2[6] = '\0';
  buf2[7] = '\0';
  buf2[8] = '\0';
  buf2[9] = '\0';
  buf2[10] = '\0';
  buf2[0xb] = '\0';
  buf2[0xc] = '\x01';
  buf2[0xd] = '\0';
  buf2[0xe] = '\0';
  buf2[0xf] = 0xff;
  buf2[0x10] = 0xff;
  buf2[0x11] = '\x01';
  buf2[0x12] = '\x02';
  buf2[0x13] = '\x03';
  buf2[0x14] = '\x04';
  buf2[0x15] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf3 + 0x18,0x1e,(PipeMsg *)(buf1 + 0x18));
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x153,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 0x18));
  stack0xfffffffffffffe78 = 0x31c0000000204;
  buf3[0] = 'w';
  buf3[1] = 'w';
  buf3[2] = 'w';
  buf3[3] = '.';
  buf3[4] = 'b';
  buf3[5] = 'a';
  buf3[6] = 'i';
  buf3[7] = 'd';
  buf3[8] = 'u';
  buf3[9] = '.';
  buf3[10] = 'c';
  buf3[0xb] = 'o';
  buf3[0xc] = 'm';
  buf3[0xd] = 0xff;
  buf3[0xe] = 0xff;
  buf3[0xf] = '\x01';
  buf3[0x10] = '\x02';
  buf3[0x11] = '\x03';
  buf3[0x12] = '\x04';
  buf3[0x13] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(local_18d + 5,0x1c,(PipeMsg *)(buf1 + 0x18));
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x158,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 0x18));
  builtin_memcpy(local_18d,"\x04\x02\x03\x03\x03",5);
  iVar1 = MsgHelper::deserializeMsg(local_18d,5,(PipeMsg *)(buf1 + 0x18));
  if (iVar1 != 0) {
    __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x15c,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 0x18));
  stack0xfffffffffffffe48 = 0xd031c0000000204;
  iVar1 = MsgHelper::deserializeMsg(buf6 + 0x18,0x1d,(PipeMsg *)(buf1 + 0x18));
  if (iVar1 != 0x1c) {
    __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x160,"void test_C2S_UDP_DATA_check()");
  }
  iVar2 = strcmp("www.baidu.com",(char *)((long)&msg.field_1 + 0xc));
  if (iVar2 != 0) {
    __assert_fail("strcmp(\"www.baidu.com\", msg.common_udp_data.ADDR.ADDR) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x161,"void test_C2S_UDP_DATA_check()");
  }
  if (msg.field_1._10_2_ != -1) {
    __assert_fail("msg.common_udp_data.ADDR.PORT == 65535",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x162,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg((PipeMsg *)(buf1 + 0x18));
  local_1d8[0] = '\x04';
  local_1d8[1] = '\x02';
  local_1d8[2] = '\0';
  local_1d8[3] = '\0';
  local_1d8[4] = '\0';
  local_1d8[5] = '\x17';
  local_1d8[6] = '\x03';
  local_1d8[7] = '\r';
  buf6[0] = 'w';
  buf6[1] = 'w';
  buf6[2] = 'w';
  buf6[3] = '.';
  buf6[4] = 'b';
  buf6[5] = 'a';
  buf6[6] = 'i';
  buf6[7] = 'd';
  buf6[8] = 'u';
  buf6[9] = '.';
  buf6[10] = 'c';
  buf6[0xb] = 'o';
  buf6[0xc] = 'm';
  buf6[0xd] = 0xff;
  buf6[0xe] = 0xff;
  buf6[0xf] = '\x01';
  buf6[0x10] = '\x02';
  buf6[0x11] = '\x03';
  buf6[0x12] = '\x04';
  buf6[0x13] = '\x05';
  buf6[0x14] = 0xee;
  iVar1 = MsgHelper::deserializeMsg(local_1d8,0x1d,(PipeMsg *)(buf1 + 0x18));
  if (iVar1 == -1) {
    MsgHelper::destroyMsg((PipeMsg *)(buf1 + 0x18));
    return;
  }
  __assert_fail("MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x168,"void test_C2S_UDP_DATA_check()");
}

Assistant:

void test_C2S_UDP_DATA_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_UDP_DATA);
	
	// error: len(0x0d) < min
	const uint8_t buf1[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x0D, 0x04, 0xFE, 0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x01020301) overflow
	const uint8_t buf2[] = {0x04, 0x02, 0x01, 0x02, 0x03, 0x04, 0x04, 0xFE, 0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: domain len(0x00)
	const uint8_t buf3[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x1C, 0x03, 0x00, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf4[] = {0x04, 0x02, 0x03, 0x03, 0x03};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
		
	const uint8_t buf5[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x1C, 0x03, 0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05, 0xEE};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == 28);
	assert(strcmp("www.baidu.com", msg.common_udp_data.ADDR.ADDR) == 0);
	assert(msg.common_udp_data.ADDR.PORT == 65535);
	
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x17) < min
	const uint8_t buf6[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x17, 0x03, 0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05, 0xEE};
	assert(MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
}